

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void Imf_2_5::staticInitialize(void)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&staticInitialize::criticalSection);
  if (iVar1 == 0) {
    if (staticInitialize()::initialized == '\0') {
      pcVar2 = TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::ChannelList>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::ChannelList>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::Compression>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::Compression>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::Chromaticities>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::DeepImageState>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::DeepImageState>::makeNewAttribute);
      pcVar2 = TypedAttribute<double>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<double>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::Envmap>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<Imf_2_5::Envmap>::makeNewAttribute);
      pcVar2 = TypedAttribute<float>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<float>::makeNewAttribute);
      pcVar2 = TypedAttribute<std::vector<float,_std::allocator<float>_>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<std::vector<float,_std::allocator<float>_>_>::
                        makeNewAttribute);
      pcVar2 = TypedAttribute<int>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<int>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::KeyCode>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<Imf_2_5::KeyCode>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::LineOrder>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<Imf_2_5::LineOrder>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Matrix33<double>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Matrix33<double>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Matrix33<float>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Matrix33<float>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Matrix44<double>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Matrix44<double>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Matrix44<float>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Matrix44<float>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::PreviewImage>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::PreviewImage>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::Rational>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<Imf_2_5::Rational>::makeNewAttribute);
      pcVar2 = TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::makeNewAttribute);
      pcVar2 = TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::TileDescription>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imf_2_5::TileDescription>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
      Attribute::registerAttributeType(pcVar2,TypedAttribute<Imf_2_5::TimeCode>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec2<double>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec2<double>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec2<float>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec2<float>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec2<int>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec2<int>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec3<double>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec3<double>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec3<float>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec3<float>_>::makeNewAttribute);
      pcVar2 = TypedAttribute<Imath_2_5::Vec3<int>_>::staticTypeName();
      Attribute::registerAttributeType
                (pcVar2,TypedAttribute<Imath_2_5::Vec3<int>_>::makeNewAttribute);
      DwaCompressor::initializeFuncs();
      staticInitialize()::initialized = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&staticInitialize::criticalSection);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void		
Header::setPreviewImage (const PreviewImage &pi)
{
    insert ("preview", PreviewImageAttribute (pi));
}